

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O2

void init_options(void)

{
  ulong uVar1;
  int (*paiVar2) [21];
  long lVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  paiVar2 = option_page;
  for (uVar1 = 0; uVar1 != 3; uVar1 = uVar1 + 1) {
    piVar4 = &options[0].type;
    iVar5 = 0;
    for (lVar3 = 0; lVar6 = (long)iVar5, lVar3 != 0x2d; lVar3 = lVar3 + 1) {
      if (iVar5 < 0x15 && uVar1 == (uint)*piVar4) {
        iVar5 = iVar5 + 1;
        option_page[uVar1][lVar6] = (int)lVar3;
      }
      piVar4 = piVar4 + 6;
    }
    piVar4 = *paiVar2 + lVar6;
    for (; lVar6 < 0x15; lVar6 = lVar6 + 1) {
      *piVar4 = 0;
      piVar4 = piVar4 + 1;
    }
    paiVar2 = paiVar2 + 1;
  }
  return;
}

Assistant:

void init_options(void)
{
	int opt, page;

	/* Allocate options to pages */
	for (page = 0; page < OPT_PAGE_MAX; page++) {
		int page_opts = 0;
		for (opt = 0; opt < OPT_MAX; opt++) {
			if ((options[opt].type == page) && (page_opts < OPT_PAGE_PER))
				option_page[page][page_opts++] = opt;
		}
		while (page_opts < OPT_PAGE_PER)
			option_page[page][page_opts++] = OPT_none;
	}
}